

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerMSL::is_out_of_bounds_tessellation_level(CompilerMSL *this,uint32_t id_lhs)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRExpression *pSVar4;
  SPIRConstant *pSVar5;
  
  bVar2 = Compiler::is_tessellating_triangles((Compiler *)this);
  if ((((bVar2) &&
       (pSVar4 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,id_lhs),
       pSVar4 != (SPIRExpression *)0x0)) && (pSVar4->access_chain == true)) &&
     ((uVar3 = Compiler::get_decoration((Compiler *)this,(ID)(pSVar4->loaded_from).id,BuiltIn),
      0xfffffffd < uVar3 - 0xd &&
      (pSVar5 = Compiler::maybe_get<spirv_cross::SPIRConstant>
                          ((Compiler *)this,
                           (pSVar4->implied_read_expressions).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr[1].id)
      , pSVar5 != (SPIRConstant *)0x0)))) {
    uVar1 = (pSVar5->m).c[0].r[0].u32;
    if (uVar3 == 0xc) {
      bVar2 = uVar1 == 1;
    }
    else {
      bVar2 = uVar1 == 3;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool CompilerMSL::is_out_of_bounds_tessellation_level(uint32_t id_lhs)
{
	if (!is_tessellating_triangles())
		return false;

	// In SPIR-V, TessLevelInner always has two elements and TessLevelOuter always has
	// four. This is true even if we are tessellating triangles. This allows clients
	// to use a single tessellation control shader with multiple tessellation evaluation
	// shaders.
	// In Metal, however, only the first element of TessLevelInner and the first three
	// of TessLevelOuter are accessible. This stems from how in Metal, the tessellation
	// levels must be stored to a dedicated buffer in a particular format that depends
	// on the patch type. Therefore, in Triangles mode, any store to the second
	// inner level or the fourth outer level must be dropped.
	const auto *e = maybe_get<SPIRExpression>(id_lhs);
	if (!e || !e->access_chain)
		return false;
	BuiltIn builtin = BuiltIn(get_decoration(e->loaded_from, DecorationBuiltIn));
	if (builtin != BuiltInTessLevelInner && builtin != BuiltInTessLevelOuter)
		return false;
	auto *c = maybe_get<SPIRConstant>(e->implied_read_expressions[1]);
	if (!c)
		return false;
	return (builtin == BuiltInTessLevelInner && c->scalar() == 1) ||
	       (builtin == BuiltInTessLevelOuter && c->scalar() == 3);
}